

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

state * getstate(lemon *lemp)

{
  int iVar1;
  plink *ppVar2;
  config *pcVar3;
  state *data;
  config *pcVar4;
  state *extraout_RAX;
  plink *ppVar5;
  plink *ppVar6;
  config *old;
  plink *ppVar7;
  config *old_1;
  
  pcVar3 = (config *)msort(current,&current->bp,Configcmp);
  basis = (config *)0x0;
  basisend = (config **)0x0;
  data = State_find(pcVar3);
  if (data == (state *)0x0) {
    Configlist_closure(lemp);
    pcVar4 = (config *)msort(current,&current->next,Configcmp);
    current = (config *)0x0;
    currentend = (config **)0x0;
    data = State_new();
    if (data == (state *)0x0) {
      getstate_cold_1();
      basis = (config *)msort(current,&current->bp,Configcmp);
      basisend = (config **)0x0;
      return extraout_RAX;
    }
    data->bp = pcVar3;
    data->cfp = pcVar4;
    iVar1 = lemp->nstate;
    lemp->nstate = iVar1 + 1;
    data->statenum = iVar1;
    data->ap = (action *)0x0;
    State_insert(data,pcVar3);
    buildshifts(lemp,data);
  }
  else {
    pcVar4 = data->bp;
    ppVar5 = plink_freelist;
    if (pcVar4 != (config *)0x0 && pcVar3 != (config *)0x0) {
      do {
        if (pcVar3->bplp != (plink *)0x0) {
          ppVar2 = pcVar3->bplp;
          ppVar7 = pcVar4->bplp;
          do {
            ppVar6 = ppVar2;
            ppVar2 = ppVar6->next;
            ppVar6->next = ppVar7;
            pcVar4->bplp = ppVar6;
            ppVar7 = ppVar6;
          } while (ppVar2 != (plink *)0x0);
        }
        ppVar2 = pcVar3->fplp;
        while (ppVar7 = ppVar2, ppVar7 != (plink *)0x0) {
          ppVar2 = ppVar7->next;
          ppVar7->next = ppVar5;
          ppVar5 = ppVar7;
          plink_freelist = ppVar7;
        }
        pcVar3->fplp = (plink *)0x0;
        pcVar3->bplp = (plink *)0x0;
        pcVar3 = pcVar3->bp;
      } while ((pcVar3 != (config *)0x0) && (pcVar4 = pcVar4->bp, pcVar4 != (config *)0x0));
    }
    pcVar3 = current;
    current = (config *)0x0;
    currentend = (config **)0x0;
    Configlist_eat(pcVar3);
  }
  return data;
}

Assistant:

state *getstate(struct lemon *lemp)
{
  struct config *cfp, *bp;
  struct state *stp;

  /* Extract the sorted basis of the new state.  The basis was constructed
  ** by prior calls to "Configlist_addbasis()". */
  Configlist_sortbasis();
  bp = Configlist_basis();

  /* Get a state with the same basis */
  stp = State_find(bp);
  if( stp ){
    /* A state with the same basis already exists!  Copy all the follow-set
    ** propagation links from the state under construction into the
    ** preexisting state, then return a pointer to the preexisting state */
    struct config *x, *y;
    for(x=bp, y=stp->bp; x && y; x=x->bp, y=y->bp){
      Plink_copy(&y->bplp,x->bplp);
      Plink_delete(x->fplp);
      x->fplp = x->bplp = 0;
    }
    cfp = Configlist_return();
    Configlist_eat(cfp);
  }else{
    /* This really is a new state.  Construct all the details */
    Configlist_closure(lemp);    /* Compute the configuration closure */
    Configlist_sort();           /* Sort the configuration closure */
    cfp = Configlist_return();   /* Get a pointer to the config list */
    stp = State_new();           /* A new state structure */
    MemoryCheck(stp);
    stp->bp = bp;                /* Remember the configuration basis */
    stp->cfp = cfp;              /* Remember the configuration closure */
    stp->statenum = lemp->nstate++; /* Every state gets a sequence number */
    stp->ap = 0;                 /* No actions, yet. */
    State_insert(stp,stp->bp);   /* Add to the state table */
    buildshifts(lemp,stp);       /* Recursively compute successor states */
  }
  return stp;
}